

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void slu_PrintInt10(char *name,int len,int *x)

{
  ulong uVar1;
  ulong uVar2;
  
  printf("%10s:",name);
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = 0;
  }
  uVar1 = 0;
  while( true ) {
    if (uVar2 == uVar1) break;
    if ((int)((uVar1 & 0xffffffff) / 10) * -10 + (int)uVar1 == 0) {
      printf("\n\t[%2d-%2d]",uVar1 & 0xffffffff,(ulong)((int)uVar1 + 9));
    }
    printf("%6d",(ulong)(uint)x[uVar1]);
    uVar1 = uVar1 + 1;
  }
  putchar(10);
  return;
}

Assistant:

void slu_PrintInt10(const char *name, int len, const int *x)
{
    register int i;
    
    printf("%10s:", name);
    for (i = 0; i < len; ++i)
    {
	if ( i % 10 == 0 ) printf("\n\t[%2d-%2d]", i, i + 9);
	printf("%6d", x[i]);
    }
    printf("\n");
}